

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_mul(m2v *A,m2v *B,m2v *AB_out)

{
  int iVar1;
  int *in_RDX;
  long in_RDI;
  int b;
  int a;
  int e;
  int x;
  int j;
  int i;
  int in_stack_ffffffffffffffd4;
  int c;
  uint r;
  int iVar2;
  int iVar3;
  
  for (iVar3 = 0; iVar3 < *in_RDX; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < in_RDX[1]; iVar2 = iVar2 + 1) {
      r = 0;
      for (c = 0; c < *(int *)(in_RDI + 4); c = c + 1) {
        in_stack_ffffffffffffffd4 = m2v_get_el((m2v *)CONCAT44(iVar3,iVar2),r,c);
        iVar1 = m2v_get_el((m2v *)CONCAT44(iVar3,iVar2),r,c);
        r = r ^ in_stack_ffffffffffffffd4 * iVar1;
      }
      m2v_set_el((m2v *)CONCAT44(iVar3,iVar2),r,c,in_stack_ffffffffffffffd4);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}